

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O2

void __thiscall
openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::ResetSignKey
          (ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *this)

{
  char cVar1;
  pointer pvVar2;
  char cVar3;
  char cVar4;
  int64_t i;
  long lVar5;
  unsigned_long *index;
  pointer puVar6;
  
  if (this->vartype != SPIN) {
    return;
  }
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&this->sign_key_,this->num_interactions_);
  for (lVar5 = 0; lVar5 < this->num_interactions_; lVar5 = lVar5 + 1) {
    pvVar2 = (this->poly_key_list_).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    cVar4 = '\x01';
    cVar3 = '\x01';
    for (puVar6 = pvVar2[lVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar6 != *(pointer *)
                   ((long)&pvVar2[lVar5].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + 8); puVar6 = puVar6 + 1) {
      cVar1 = (char)(this->variables).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[*puVar6];
      cVar4 = cVar3 * cVar1;
      cVar3 = cVar3 * cVar1;
    }
    (this->sign_key_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5] = cVar4;
  }
  return;
}

Assistant:

void ResetSignKey() {
    if (vartype != cimod::Vartype::SPIN) {
      return;
    }
    sign_key_.resize(num_interactions_);
#pragma omp parallel for
    for (int64_t i = 0; i < num_interactions_; ++i) {
      int8_t sign_key = 1;
      for (const auto &index : poly_key_list_[i]) {
        sign_key *= variables[index];
      }
      sign_key_[i] = sign_key;
    }
  }